

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLMG.cpp
# Opt level: O2

void __thiscall
amrex::MLMG::compResidual
          (MLMG *this,Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *a_res,
          Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *a_sol,
          Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *a_rhs)

{
  Vector<amrex::Any,_std::allocator<amrex::Any>_> *this_00;
  Vector<int,_std::allocator<int>_> *this_01;
  uint uVar1;
  MLLinOp *pMVar2;
  pointer pAVar3;
  __uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_> _Var4;
  undefined8 uVar5;
  _func_int **pp_Var6;
  MultiFab *pMVar7;
  pointer ppMVar8;
  _Head_base<0UL,_amrex::Any::innards_base_*,_false> _Var9;
  long lVar10;
  bool bVar11;
  int iVar12;
  MultiFab *pMVar13;
  MultiFab *pMVar14;
  MultiFab *pMVar15;
  ulong uVar16;
  ulong uVar17;
  _Head_base<0UL,_amrex::Any::innards_base_*,_false> local_a0;
  int local_94;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *local_90;
  IntVect ng_sol;
  _Head_base<0UL,_amrex::Any::innards_base_*,_false> local_50;
  MLLinOp *local_48;
  MultiFab *local_40;
  long local_38;
  
  local_90 = a_res;
  local_94 = (*this->linop->_vptr_MLLinOp[5])();
  ng_sol.vect[0] = 1;
  ng_sol.vect[1] = 1;
  ng_sol.vect[2] = 1;
  uVar16 = (ulong)(uint)(this->linop->info).hidden_direction;
  if (uVar16 < 3) {
    ng_sol.vect[uVar16] = 0;
  }
  this_00 = &this->sol;
  std::vector<amrex::Any,_std::allocator<amrex::Any>_>::resize
            (&this_00->super_vector<amrex::Any,_std::allocator<amrex::Any>_>,(long)this->namrlevs);
  this_01 = &this->sol_is_alias;
  local_a0._M_head_impl._0_4_ = 1;
  std::vector<int,_std::allocator<int>_>::resize
            (&this_01->super_vector<int,_std::allocator<int>_>,(long)this->namrlevs,
             (value_type_conflict *)&local_a0);
  uVar16 = 0;
  do {
    if ((long)this->namrlevs <= (long)uVar16) {
      pp_Var6 = this->linop->_vptr_MLLinOp;
      if (this->linop_prepared == false) {
        (*pp_Var6[0x1d])();
        this->linop_prepared = true;
      }
      else {
        iVar12 = (*pp_Var6[7])();
        if ((char)iVar12 != '\0') {
          (*this->linop->_vptr_MLLinOp[8])();
        }
      }
      local_48 = this->linop;
      local_38 = (ulong)(this->finest_amr_lev + 1) << 3;
      uVar1 = this->finest_amr_lev;
      while (uVar16 = (ulong)uVar1, -1 < (int)uVar1) {
        pMVar13 = (MultiFab *)0x0;
        uVar17 = 0;
        if (uVar1 != 0) {
          pMVar13 = Any::get<amrex::MultiFab>
                              ((this_00->super_vector<amrex::Any,_std::allocator<amrex::Any>_>).
                               super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                               super__Vector_impl_data._M_start + (uVar16 - 1));
          uVar17 = uVar16;
        }
        pMVar7 = (a_rhs->
                 super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>).
                 super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar17];
        pMVar2 = this->linop;
        pMVar15 = (local_90->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                  super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar17];
        pMVar14 = Any::get<amrex::MultiFab>
                            ((this->sol).super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                             super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                             super__Vector_impl_data._M_start + uVar17);
        (*pMVar2->_vptr_MLLinOp[0x10])(pMVar2,uVar16,pMVar15,pMVar14,pMVar7,pMVar13);
        lVar10 = local_38;
        if ((int)uVar1 < this->finest_amr_lev) {
          pMVar2 = this->linop;
          pMVar13 = (local_90->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                    super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar17];
          local_40 = Any::get<amrex::MultiFab>
                               ((this->sol).super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                                super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                                super__Vector_impl_data._M_start + uVar17);
          uVar5 = *(undefined8 *)
                   ((long)(local_90->
                          super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                          super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                          _M_impl.super__Vector_impl_data._M_start + lVar10);
          pMVar15 = Any::get<amrex::MultiFab>
                              ((Any *)((long)&(((this->sol).
                                                super_vector<amrex::Any,_std::allocator<amrex::Any>_>
                                                .
                                                super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->m_ptr).
                                              _M_t.
                                              super___uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                                              .
                                              super__Head_base<0UL,_amrex::Any::innards_base_*,_false>
                                              ._M_head_impl + lVar10));
          (*pMVar2->_vptr_MLLinOp[0x12])
                    (pMVar2,uVar16,pMVar13,local_40,pMVar7,uVar5,pMVar15,
                     *(undefined8 *)
                      ((long)(a_rhs->
                             super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                             ).
                             super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar10));
          bVar11 = MLLinOp::isCellCentered(this->linop);
          if (bVar11) {
            ppMVar8 = (local_90->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                      ).super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            EB_average_down(*(MultiFab **)((long)ppMVar8 + lVar10),ppMVar8[uVar17],0,local_94,
                            (local_48->m_amr_ref_ratio).super_vector<int,_std::allocator<int>_>.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar17]);
          }
        }
        local_38 = lVar10 + -8;
        uVar1 = uVar1 - 1;
      }
      return;
    }
    pMVar13 = (a_sol->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
              super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
              super__Vector_impl_data._M_start[uVar16];
    if (this->cf_strategy == ghostnodes) {
LAB_004e5e72:
      pMVar2 = this->linop;
      Any::Any<amrex::MultiFab&>((Any *)&local_50,pMVar13);
      (*pMVar2->_vptr_MLLinOp[0x2a])((Any *)&local_a0,pMVar2,&local_50);
      _Var9._M_head_impl = (innards_base *)local_a0;
      pAVar3 = (this_00->super_vector<amrex::Any,_std::allocator<amrex::Any>_>).
               super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_a0._M_head_impl = (innards_base *)0x0;
      _Var4._M_t.
      super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
      .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>._M_head_impl =
           *(tuple<amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_> *)
            &pAVar3[uVar16].m_ptr._M_t;
      pAVar3[uVar16].m_ptr._M_t =
           (__uniq_ptr_data<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>,_true,_true>
            )_Var9._M_head_impl;
      if ((__uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
          )_Var4._M_t.
           super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
           .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
          )0x0) {
        (**(code **)(*(long *)_Var4._M_t.
                              super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                              .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>._M_head_impl
                    + 0x10))();
      }
      if ((_Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
           )local_a0._M_head_impl != (innards_base *)0x0) {
        (**(code **)(*(long *)local_a0._M_head_impl + 0x10))();
      }
      local_a0._M_head_impl = (innards_base *)0x0;
      if (local_50._M_head_impl != (innards_base *)0x0) {
        (*(local_50._M_head_impl)->_vptr_innards_base[2])();
      }
      (this_01->super_vector<int,_std::allocator<int>_>).
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[uVar16]
           = 1;
    }
    else {
      uVar5 = *(undefined8 *)
               (pMVar13->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect;
      if (((ng_sol.vect[0] == (int)uVar5) && (ng_sol.vect[1] == (int)((ulong)uVar5 >> 0x20))) &&
         ((pMVar13->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[2] ==
          ng_sol.vect[2])) goto LAB_004e5e72;
      if ((this_01->super_vector<int,_std::allocator<int>_>).
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
          [uVar16] != 0) {
        (*this->linop->_vptr_MLLinOp[0x27])
                  ((Any *)&local_a0,this->linop,uVar16 & 0xffffffff,0,&ng_sol);
        _Var9._M_head_impl = (innards_base *)local_a0;
        pAVar3 = (this->sol).super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                 super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_a0._M_head_impl = (innards_base *)0x0;
        _Var4._M_t.
        super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
        .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>._M_head_impl =
             *(tuple<amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_> *)
              &pAVar3[uVar16].m_ptr._M_t;
        pAVar3[uVar16].m_ptr._M_t =
             (__uniq_ptr_data<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>,_true,_true>
              )_Var9._M_head_impl;
        if ((__uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
             )_Var4._M_t.
              super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
              .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>._M_head_impl !=
            (__uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
             )0x0) {
          (**(code **)(*(long *)_Var4._M_t.
                                super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                                .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>.
                                _M_head_impl + 0x10))();
        }
        if ((_Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
             )local_a0._M_head_impl != (innards_base *)0x0) {
          (*(local_a0._M_head_impl)->_vptr_innards_base[2])();
        }
      }
      pMVar13 = Any::get<amrex::MultiFab>
                          ((this_00->super_vector<amrex::Any,_std::allocator<amrex::Any>_>).
                           super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                           super__Vector_impl_data._M_start + uVar16);
      MultiFab::Copy(pMVar13,(a_sol->
                             super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                             super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar16],0,0,local_94,0);
    }
    uVar16 = uVar16 + 1;
  } while( true );
}

Assistant:

void
MLMG::compResidual (const Vector<MultiFab*>& a_res, const Vector<MultiFab*>& a_sol,
                    const Vector<MultiFab const*>& a_rhs)
{
    BL_PROFILE("MLMG::compResidual()");

    const int ncomp = linop.getNComp();
    IntVect ng_sol(1);
    if (linop.hasHiddenDimension()) ng_sol[linop.hiddenDirection()] = 0;

    sol.resize(namrlevs);
    sol_is_alias.resize(namrlevs,true);
    for (int alev = 0; alev < namrlevs; ++alev)
    {
        if (cf_strategy == CFStrategy::ghostnodes || a_sol[alev]->nGrowVect() == ng_sol)
        {
            sol[alev] = linop.AnyMakeAlias(*a_sol[alev]);
            sol_is_alias[alev] = true;
        }
        else
        {
            if (sol_is_alias[alev])
            {
                sol[alev] = linop.AnyMake(alev, 0, ng_sol);
            }
            MultiFab::Copy(sol[alev].get<MultiFab>(), *a_sol[alev], 0, 0, ncomp, 0);
        }
    }

    if (!linop_prepared) {
        linop.prepareForSolve();
        linop_prepared = true;
    } else if (linop.needsUpdate()) {
        linop.update();
    }

    const auto& amrrr = linop.AMRRefRatio();

    for (int alev = finest_amr_lev; alev >= 0; --alev) {
        const MultiFab* crse_bcdata = (alev > 0) ? &(sol[alev-1].get<MultiFab>()) : nullptr;
        const MultiFab* prhs = a_rhs[alev];
#if (AMREX_SPACEDIM != 3)
        int nghost = (cf_strategy == CFStrategy::ghostnodes) ? linop.getNGrow(alev) : 0;
        Any rhstmp_a(MultiFab(prhs->boxArray(), prhs->DistributionMap(), ncomp, nghost,
                              MFInfo(), *linop.Factory(alev)));
        MultiFab& rhstmp = rhstmp_a.get<MultiFab>();
        MultiFab::Copy(rhstmp, *prhs, 0, 0, ncomp, nghost);
        linop.applyMetricTerm(alev, 0, rhstmp_a);
        linop.unimposeNeumannBC(alev, rhstmp_a);
        linop.applyInhomogNeumannTerm(alev, rhstmp_a);
        prhs = &rhstmp;
#endif
        linop.solutionResidual(alev, *a_res[alev], sol[alev].get<MultiFab>(), *prhs, crse_bcdata);
        if (alev < finest_amr_lev) {
            linop.reflux(alev, *a_res[alev], sol[alev].get<MultiFab>(), *prhs,
                         *a_res[alev+1], sol[alev+1].get<MultiFab>(), *a_rhs[alev+1]);
            if (linop.isCellCentered()) {
#ifdef AMREX_USE_EB
                amrex::EB_average_down(*a_res[alev+1], *a_res[alev], 0, ncomp, amrrr[alev]);
#else
                amrex::average_down(*a_res[alev+1], *a_res[alev], 0, ncomp, amrrr[alev]);
#endif
            }
        }
    }


#if (AMREX_SPACEDIM != 3)
    for (int alev = 0; alev <= finest_amr_lev; ++alev) {
        linop.unapplyMetricTerm(alev, 0, *a_res[alev]);
    }
#endif
}